

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_parsed_linkage(lys_ypr_ctx_conflict *pctx,lysp_module *modp)

{
  uint16_t *puVar1;
  lysp_import *plVar2;
  lysp_ext_instance *plVar3;
  lysp_include *plVar4;
  uint uVar5;
  lysp_ext_instance *plVar6;
  ulong uVar7;
  uint64_t u;
  lysp_ext_instance *plVar8;
  ulong uVar9;
  lysp_ext_instance *plVar10;
  
  uVar9 = 0;
  while( true ) {
    plVar2 = modp->imports;
    if (plVar2 == (lysp_import *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(plVar2[-1].rev + 6);
    }
    if (uVar7 <= uVar9) break;
    if ((plVar2[uVar9].flags & 0x1000) == 0) {
      ypr_open(pctx,"import","module",plVar2[uVar9].name,'\x01');
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 + 1;
      plVar3 = modp->imports[uVar9].exts;
      plVar8 = (lysp_ext_instance *)0x0;
      plVar10 = plVar3;
      while( true ) {
        if (plVar3 == (lysp_ext_instance *)0x0) {
          plVar6 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar6 = plVar3[-1].exts;
        }
        if (plVar6 <= plVar8) break;
        yprp_extension_instance(pctx,LY_STMT_IMPORT,'\0',plVar10,(int8_t *)0x0);
        plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
        plVar10 = plVar10 + 1;
      }
      ypr_substmt(pctx,LY_STMT_PREFIX,'\0',modp->imports[uVar9].prefix,modp->imports[uVar9].exts);
      plVar2 = modp->imports;
      if (plVar2[uVar9].rev[0] != '\0') {
        ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',plVar2[uVar9].rev,plVar2[uVar9].exts);
      }
      ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',modp->imports[uVar9].dsc,modp->imports[uVar9].exts);
      ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',modp->imports[uVar9].ref,modp->imports[uVar9].exts);
      uVar5 = *(int *)((long)&pctx->field_0 + 8) - 1;
      (pctx->field_0).field_0.level = (uint16_t)uVar5;
      uVar5 = (uVar5 & 0xffff) * 2;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
          (undefined1  [24])0x0) {
        uVar5 = 0;
      }
      ly_print_((pctx->field_0).field_0.out,"%*s</%s>\n",(ulong)uVar5,"","import");
    }
    uVar9 = uVar9 + 1;
  }
  uVar9 = 0;
  while( true ) {
    plVar4 = modp->includes;
    if (plVar4 == (lysp_include *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(plVar4[-1].rev + 8);
    }
    if (uVar7 <= uVar9) break;
    if (plVar4[uVar9].injected == '\0') {
      if ((((plVar4[uVar9].rev[0] == '\0') && (plVar4[uVar9].dsc == (char *)0x0)) &&
          (plVar4[uVar9].ref == (char *)0x0)) && (plVar4[uVar9].exts == (lysp_ext_instance *)0x0)) {
        ypr_open(pctx,"include","module",plVar4[uVar9].name,-1);
      }
      else {
        ypr_open(pctx,"include","module",plVar4[uVar9].name,'\x01');
        puVar1 = &(pctx->field_0).field_0.level;
        *puVar1 = *puVar1 + 1;
        plVar3 = modp->includes[uVar9].exts;
        plVar8 = (lysp_ext_instance *)0x0;
        plVar10 = plVar3;
        while( true ) {
          if (plVar3 == (lysp_ext_instance *)0x0) {
            plVar6 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar6 = plVar3[-1].exts;
          }
          if (plVar6 <= plVar8) break;
          yprp_extension_instance(pctx,LY_STMT_INCLUDE,'\0',plVar10,(int8_t *)0x0);
          plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
          plVar10 = plVar10 + 1;
        }
        plVar4 = modp->includes;
        if (plVar4[uVar9].rev[0] != '\0') {
          ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',plVar4[uVar9].rev,plVar4[uVar9].exts);
        }
        ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',modp->includes[uVar9].dsc,
                    modp->includes[uVar9].exts);
        ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',modp->includes[uVar9].ref,modp->includes[uVar9].exts
                   );
        uVar5 = *(int *)((long)&pctx->field_0 + 8) - 1;
        (pctx->field_0).field_0.level = (uint16_t)uVar5;
        uVar5 = (uVar5 & 0xffff) * 2;
        if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
            (undefined1  [24])0x0) {
          uVar5 = 0;
        }
        ly_print_((pctx->field_0).field_0.out,"%*s</%s>\n",(ulong)uVar5,"","include");
      }
    }
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

static void
yin_print_parsed_linkage(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(modp->imports, u) {
        if (modp->imports[u].flags & LYS_INTERNAL) {
            continue;
        }

        ypr_open(pctx, "import", "module", modp->imports[u].name, 1);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_IMPORT, 0, modp->imports[u].exts, NULL);
        ypr_substmt(pctx, LY_STMT_PREFIX, 0, modp->imports[u].prefix, modp->imports[u].exts);
        if (modp->imports[u].rev[0]) {
            ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->imports[u].rev, modp->imports[u].exts);
        }
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->imports[u].dsc, modp->imports[u].exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->imports[u].ref, modp->imports[u].exts);
        LEVEL--;
        ypr_close(pctx, "import", 1);
    }
    LY_ARRAY_FOR(modp->includes, u) {
        if (modp->includes[u].injected) {
            /* do not print the includes injected from submodules */
            continue;
        }
        if (modp->includes[u].rev[0] || modp->includes[u].dsc || modp->includes[u].ref || modp->includes[u].exts) {
            ypr_open(pctx, "include", "module", modp->includes[u].name, 1);
            LEVEL++;
            yprp_extension_instances(pctx, LY_STMT_INCLUDE, 0, modp->includes[u].exts, NULL);
            if (modp->includes[u].rev[0]) {
                ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->includes[u].rev, modp->includes[u].exts);
            }
            ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->includes[u].dsc, modp->includes[u].exts);
            ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->includes[u].ref, modp->includes[u].exts);
            LEVEL--;
            ypr_close(pctx, "include", 1);
        } else {
            ypr_open(pctx, "include", "module", modp->includes[u].name, -1);
        }
    }
}